

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  pointer pbVar1;
  pointer pbVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *outputAn_2;
  pointer pbVar4;
  iterator __begin2;
  pointer pbVar5;
  
  synAnalysis();
  pbVar5 = outputErr_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar4 = outputErr_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (outputErr_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      outputErr_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    copyPropagation();
    copyPropagation();
    multiSimplifier();
    copyPropagation();
    changeSameName();
    counterTempVar();
    allocateRegisterForGlobalVar();
    outputIntermediateCode();
    pbVar4 = intermediateCode_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar5 = intermediateCode_abi_cxx11_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar4; pbVar5 = pbVar5 + 1)
    {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)midGross,(pbVar5->_M_dataplus)._M_p,pbVar5->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    generateMIPSAssembly();
    pbVar5 = mipsCode_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar4 = mipsCode_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (mipsCode_abi_cxx11_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        mipsCode_abi_cxx11_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)mips,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        pbVar2 = mipsCode_abi_cxx11_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar4 = pbVar4 + 1;
        pbVar1 = mipsCode_abi_cxx11_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (pbVar4 != pbVar5);
      for (; pbVar1 != pbVar2; pbVar1 = pbVar1 + 1) {
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)mipsTest,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
    }
  }
  else {
    do {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)err,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar5);
  }
  fclose((FILE *)testfile);
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::close();
  return 0;
}

Assistant:

int main() {
    synAnalysis();
    if (outputErr.empty()) {
        copyPropagation();
        copyPropagation();
        multiSimplifier();
        copyPropagation();
        changeSameName();
        counterTempVar();
        allocateRegisterForGlobalVar();
        outputIntermediateCode();
        for (auto &outputAn : intermediateCode) {
            midGross << outputAn << endl;
        }
        generateMIPSAssembly();
        for (auto &outputAn : mipsCode) {
            mips << outputAn << endl;
        }
        for (auto &outputAn : mipsCode) {
            mipsTest << outputAn << endl;
        }
    } else {
        for (auto &outputAn : outputErr) {
            err << outputAn << endl;
        }
    }
    fclose(testfile);
    out.close();
    err.close();
    midGross.close();
    midOptimize.close();
    mips.close();
    return 0;
}